

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void non_empty_closedir_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  uv__io_t **ppuVar4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  size_t sVar7;
  undefined4 *puVar8;
  long extraout_RDX;
  addrinfo *ai;
  addrinfo *ai_00;
  long extraout_RDX_00;
  uv__io_t **unaff_RBX;
  char *__needle;
  uv_getaddrinfo_t *req_00;
  uv_handle_t *handle;
  int *piVar9;
  long lVar10;
  uv_getaddrinfo_t uStack_6a8;
  uv_loop_t *puStack_608;
  uv_loop_t *puStack_600;
  uv_loop_t *puStack_5f8;
  uv_getaddrinfo_t uStack_5f0;
  uv_loop_t *puStack_550;
  code *pcStack_548;
  uv_getaddrinfo_t uStack_540;
  uv_loop_t *puStack_4a0;
  undefined1 auStack_490 [40];
  code *pcStack_468;
  undefined1 *puStack_458;
  void *pvStack_448;
  void *pvStack_440;
  void *pvStack_438;
  uv__io_t **ppuStack_428;
  uv__io_t **ppuStack_418;
  undefined8 uStack_410;
  
  if (req == &closedir_req) {
    if (closedir_req.result == 0) {
      uv_fs_req_cleanup(&closedir_req);
      non_empty_closedir_cb_count = non_empty_closedir_cb_count + 1;
      return;
    }
  }
  else {
    non_empty_closedir_cb_cold_1();
  }
  non_empty_closedir_cb_cold_2();
  ppuStack_418 = (uv__io_t **)0x400;
  ppuStack_428 = (uv__io_t **)0x15895a;
  iVar2 = uv_exepath((char *)&uStack_410,(size_t *)&ppuStack_418);
  if (iVar2 == 0) {
    __needle = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      __needle = executable_path + 2;
    }
    ppuStack_428 = (uv__io_t **)0x15898f;
    __s1 = strstr((char *)&uStack_410,__needle);
    if (__s1 == (char *)0x0) {
LAB_00158aa1:
      ppuStack_428 = (uv__io_t **)0x158aa6;
      run_test_get_currentexe_cold_13();
      unaff_RBX = (uv__io_t **)__needle;
      goto LAB_00158aa6;
    }
    ppuStack_428 = (uv__io_t **)0x1589a3;
    iVar2 = strcmp(__s1,__needle);
    unaff_RBX = ppuStack_418;
    if (iVar2 != 0) goto LAB_00158aa1;
    ppuStack_428 = (uv__io_t **)0x1589ba;
    ppuVar4 = (uv__io_t **)strlen((char *)&uStack_410);
    if (unaff_RBX != ppuVar4) goto LAB_00158aab;
    ppuStack_418 = (uv__io_t **)0x400;
    ppuStack_428 = (uv__io_t **)0x1589d6;
    iVar2 = uv_exepath((char *)0x0,(size_t *)&ppuStack_418);
    if (iVar2 != -0x16) goto LAB_00158ab0;
    ppuStack_428 = (uv__io_t **)0x1589eb;
    iVar2 = uv_exepath((char *)&uStack_410,(size_t *)0x0);
    if (iVar2 != -0x16) goto LAB_00158ab5;
    ppuStack_418 = (uv__io_t **)0x0;
    ppuStack_428 = (uv__io_t **)0x158a0a;
    iVar2 = uv_exepath((char *)&uStack_410,(size_t *)&ppuStack_418);
    if (iVar2 != -0x16) goto LAB_00158aba;
    unaff_RBX = (uv__io_t **)&uStack_410;
    ppuStack_428 = (uv__io_t **)0x158a2a;
    memset(unaff_RBX,0xff,0x400);
    ppuStack_418 = (uv__io_t **)0x1;
    ppuStack_428 = (uv__io_t **)0x158a3e;
    iVar2 = uv_exepath((char *)unaff_RBX,(size_t *)&ppuStack_418);
    if (iVar2 != 0) goto LAB_00158abf;
    if (ppuStack_418 != (uv__io_t **)0x0) goto LAB_00158ac4;
    if ((char)uStack_410 != '\0') goto LAB_00158ac9;
    unaff_RBX = (uv__io_t **)&uStack_410;
    ppuStack_428 = (uv__io_t **)0x158a68;
    memset(unaff_RBX,0xff,0x400);
    ppuStack_418 = (uv__io_t **)0x2;
    ppuStack_428 = (uv__io_t **)0x158a7c;
    iVar2 = uv_exepath((char *)unaff_RBX,(size_t *)&ppuStack_418);
    if (iVar2 != 0) goto LAB_00158ace;
    if (ppuStack_418 != (uv__io_t **)0x1) goto LAB_00158ad3;
    if ((char)uStack_410 == '\0') goto LAB_00158ad8;
    if (uStack_410._1_1_ == '\0') {
      return;
    }
  }
  else {
LAB_00158aa6:
    ppuStack_428 = (uv__io_t **)0x158aab;
    run_test_get_currentexe_cold_1();
LAB_00158aab:
    ppuStack_428 = (uv__io_t **)0x158ab0;
    run_test_get_currentexe_cold_2();
LAB_00158ab0:
    ppuStack_428 = (uv__io_t **)0x158ab5;
    run_test_get_currentexe_cold_3();
LAB_00158ab5:
    ppuStack_428 = (uv__io_t **)0x158aba;
    run_test_get_currentexe_cold_4();
LAB_00158aba:
    ppuStack_428 = (uv__io_t **)0x158abf;
    run_test_get_currentexe_cold_5();
LAB_00158abf:
    ppuStack_428 = (uv__io_t **)0x158ac4;
    run_test_get_currentexe_cold_6();
LAB_00158ac4:
    ppuStack_428 = (uv__io_t **)0x158ac9;
    run_test_get_currentexe_cold_7();
LAB_00158ac9:
    ppuStack_428 = (uv__io_t **)0x158ace;
    run_test_get_currentexe_cold_8();
LAB_00158ace:
    ppuStack_428 = (uv__io_t **)0x158ad3;
    run_test_get_currentexe_cold_9();
LAB_00158ad3:
    ppuStack_428 = (uv__io_t **)0x158ad8;
    run_test_get_currentexe_cold_10();
LAB_00158ad8:
    ppuStack_428 = (uv__io_t **)0x158add;
    run_test_get_currentexe_cold_12();
  }
  ppuStack_428 = (uv__io_t **)0x158ae2;
  run_test_get_currentexe_cold_11();
  pvStack_448 = (void *)0xbff0000000000000;
  pvStack_440 = (void *)0xbff0000000000000;
  pvStack_438 = (void *)0xbff0000000000000;
  ppuStack_428 = unaff_RBX;
  uv_loadavg((double *)&pvStack_448);
  if ((double)pvStack_448 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_00158b45:
    run_test_get_loadavg_cold_2();
  }
  else {
    if ((double)pvStack_440 < 0.0) goto LAB_00158b45;
    if (0.0 <= (double)pvStack_438) {
      return;
    }
  }
  run_test_get_loadavg_cold_1();
  pcStack_468 = (code *)0x158b59;
  puStack_458 = (undefined1 *)&pvStack_448;
  puVar5 = (uv_loop_t *)uv_get_free_memory();
  pcStack_468 = (code *)0x158b61;
  puVar6 = (uv_loop_t *)uv_get_total_memory();
  pcStack_468 = (code *)0x158b69;
  uv_get_constrained_memory();
  pcStack_468 = (code *)0x158b80;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",puVar5,puVar6);
  if (puVar5 == (uv_loop_t *)0x0) {
    pcStack_468 = (code *)0x158b9e;
    run_test_get_memory_cold_3();
LAB_00158b9e:
    pcStack_468 = (code *)0x158ba3;
    run_test_get_memory_cold_2();
  }
  else {
    if (puVar6 == (uv_loop_t *)0x0) goto LAB_00158b9e;
    if (puVar5 < puVar6) {
      return;
    }
  }
  pcStack_468 = run_test_get_passwd;
  run_test_get_memory_cold_1();
  puStack_4a0 = (uv_loop_t *)0x158bb7;
  pcStack_468 = (code *)puVar5;
  iVar2 = uv_os_get_passwd((uv_passwd_t *)auStack_490);
  uVar1 = auStack_490._32_8_;
  if (iVar2 == 0) {
    if (*(char *)auStack_490._0_8_ == '\0') goto LAB_00158c7b;
    if (*(char *)auStack_490._24_8_ == '\0') goto LAB_00158c80;
    puStack_4a0 = (uv_loop_t *)0x158be8;
    sVar7 = strlen((char *)auStack_490._32_8_);
    puVar5 = (uv_loop_t *)uVar1;
    if (sVar7 != 1) {
      if (sVar7 != 0) {
        if (*(char *)(uVar1 + (sVar7 - 1)) == '/') {
          puStack_4a0 = (uv_loop_t *)0x158c03;
          run_test_get_passwd_cold_13();
          goto LAB_00158c03;
        }
        goto LAB_00158c0c;
      }
      goto LAB_00158cb2;
    }
LAB_00158c03:
    if (*(char *)uVar1 == '/') {
LAB_00158c0c:
      if ((long)auStack_490._8_8_ < 0) goto LAB_00158c85;
      if ((long)auStack_490._16_8_ < 0) goto LAB_00158c8a;
      puVar5 = (uv_loop_t *)auStack_490;
      puStack_4a0 = (uv_loop_t *)0x158c29;
      uv_os_free_passwd((uv_passwd_t *)puVar5);
      if ((char *)auStack_490._0_8_ != (char *)0x0) goto LAB_00158c8f;
      if ((char *)auStack_490._24_8_ != (char *)0x0) goto LAB_00158c94;
      if ((uv_loop_t *)auStack_490._32_8_ != (uv_loop_t *)0x0) goto LAB_00158c99;
      puVar5 = (uv_loop_t *)auStack_490;
      puStack_4a0 = (uv_loop_t *)0x158c4c;
      uv_os_free_passwd((uv_passwd_t *)puVar5);
      if ((char *)auStack_490._0_8_ != (char *)0x0) goto LAB_00158c9e;
      if ((char *)auStack_490._24_8_ != (char *)0x0) goto LAB_00158ca3;
      if ((uv_loop_t *)auStack_490._32_8_ != (uv_loop_t *)0x0) goto LAB_00158ca8;
      puStack_4a0 = (uv_loop_t *)0x158c69;
      iVar2 = uv_os_get_passwd((uv_passwd_t *)0x0);
      if (iVar2 == -0x16) {
        return;
      }
      goto LAB_00158cad;
    }
  }
  else {
    puStack_4a0 = (uv_loop_t *)0x158c7b;
    run_test_get_passwd_cold_1();
LAB_00158c7b:
    puStack_4a0 = (uv_loop_t *)0x158c80;
    run_test_get_passwd_cold_15();
LAB_00158c80:
    puStack_4a0 = (uv_loop_t *)0x158c85;
    run_test_get_passwd_cold_14();
LAB_00158c85:
    puStack_4a0 = (uv_loop_t *)0x158c8a;
    run_test_get_passwd_cold_4();
LAB_00158c8a:
    puStack_4a0 = (uv_loop_t *)0x158c8f;
    run_test_get_passwd_cold_5();
LAB_00158c8f:
    puStack_4a0 = (uv_loop_t *)0x158c94;
    run_test_get_passwd_cold_6();
LAB_00158c94:
    puStack_4a0 = (uv_loop_t *)0x158c99;
    run_test_get_passwd_cold_7();
LAB_00158c99:
    puStack_4a0 = (uv_loop_t *)0x158c9e;
    run_test_get_passwd_cold_8();
LAB_00158c9e:
    puStack_4a0 = (uv_loop_t *)0x158ca3;
    run_test_get_passwd_cold_9();
LAB_00158ca3:
    puStack_4a0 = (uv_loop_t *)0x158ca8;
    run_test_get_passwd_cold_10();
LAB_00158ca8:
    puStack_4a0 = (uv_loop_t *)0x158cad;
    run_test_get_passwd_cold_11();
LAB_00158cad:
    puStack_4a0 = (uv_loop_t *)0x158cb2;
    run_test_get_passwd_cold_12();
LAB_00158cb2:
    puStack_4a0 = (uv_loop_t *)0x158cb7;
    run_test_get_passwd_cold_3();
  }
  puStack_4a0 = (uv_loop_t *)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar2 = (int)&uStack_540;
  pcStack_548 = (code *)0x158cc9;
  puStack_4a0 = puVar5;
  puVar6 = uv_default_loop();
  pcStack_548 = (code *)0x158ce3;
  iVar3 = uv_getaddrinfo(puVar6,&uStack_540,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
  if (iVar3 == -0x16) {
    pcStack_548 = (code *)0x158cf1;
    puVar6 = uv_default_loop();
    pcStack_548 = (code *)0x158d10;
    iVar2 = (int)&uStack_540;
    iVar3 = uv_getaddrinfo(puVar6,&uStack_540,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar3 != 0) goto LAB_00158d74;
    pcStack_548 = (code *)0x158d19;
    puVar6 = uv_default_loop();
    iVar2 = 0;
    pcStack_548 = (code *)0x158d23;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00158d79;
    if (fail_cb_called != 1) goto LAB_00158d7e;
    pcStack_548 = (code *)0x158d35;
    puVar5 = uv_default_loop();
    pcStack_548 = (code *)0x158d49;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    pcStack_548 = (code *)0x158d53;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_548 = (code *)0x158d58;
    puVar6 = uv_default_loop();
    pcStack_548 = (code *)0x158d60;
    iVar3 = uv_loop_close(puVar6);
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_548 = (code *)0x158d74;
    run_test_getaddrinfo_fail_cold_1();
LAB_00158d74:
    pcStack_548 = (code *)0x158d79;
    run_test_getaddrinfo_fail_cold_2();
LAB_00158d79:
    pcStack_548 = (code *)0x158d7e;
    run_test_getaddrinfo_fail_cold_3();
LAB_00158d7e:
    pcStack_548 = (code *)0x158d83;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_548 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_00158daf;
    if (extraout_RDX == 0) {
      puStack_550 = (uv_loop_t *)0x158da2;
      uv_freeaddrinfo((addrinfo *)0x0);
      fail_cb_called = fail_cb_called + 1;
      return;
    }
  }
  else {
    puStack_550 = (uv_loop_t *)0x158daf;
    getaddrinfo_fail_cb_cold_1();
LAB_00158daf:
    puStack_550 = (uv_loop_t *)0x158db4;
    getaddrinfo_fail_cb_cold_2();
  }
  puStack_550 = (uv_loop_t *)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  puStack_5f8 = (uv_loop_t *)0x158dc6;
  puStack_550 = puVar5;
  puVar6 = uv_default_loop();
  puStack_5f8 = (uv_loop_t *)0x158de0;
  iVar2 = uv_getaddrinfo(puVar6,&uStack_5f0,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 < 0) {
    puStack_5f8 = (uv_loop_t *)0x158df1;
    uv_freeaddrinfo(uStack_5f0.addrinfo);
    puStack_5f8 = (uv_loop_t *)0x158df6;
    puVar5 = uv_default_loop();
    puStack_5f8 = (uv_loop_t *)0x158e0a;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_5f8 = (uv_loop_t *)0x158e14;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_5f8 = (uv_loop_t *)0x158e19;
    puVar6 = uv_default_loop();
    puStack_5f8 = (uv_loop_t *)0x158e21;
    iVar2 = uv_loop_close(puVar6);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    puStack_5f8 = (uv_loop_t *)0x158e35;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  puStack_5f8 = (uv_loop_t *)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  puStack_600 = (uv_loop_t *)0x158e45;
  puStack_5f8 = puVar5;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puStack_600 = (uv_loop_t *)0x158e51;
  puVar6 = uv_default_loop();
  puStack_600 = (uv_loop_t *)0x158e74;
  iVar2 = uv_getaddrinfo(puVar6,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    puStack_600 = (uv_loop_t *)0x158e7d;
    puVar6 = uv_default_loop();
    puStack_600 = (uv_loop_t *)0x158e87;
    uv_run(puVar6,UV_RUN_DEFAULT);
    if (getaddrinfo_cbs != 1) goto LAB_00158ecd;
    puStack_600 = (uv_loop_t *)0x158e95;
    puVar5 = uv_default_loop();
    puStack_600 = (uv_loop_t *)0x158ea9;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_600 = (uv_loop_t *)0x158eb3;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_600 = (uv_loop_t *)0x158eb8;
    puVar6 = uv_default_loop();
    puStack_600 = (uv_loop_t *)0x158ec0;
    iVar2 = uv_loop_close(puVar6);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    puStack_600 = (uv_loop_t *)0x158ecd;
    run_test_getaddrinfo_basic_cold_1();
LAB_00158ecd:
    puStack_600 = (uv_loop_t *)0x158ed2;
    run_test_getaddrinfo_basic_cold_2();
  }
  puStack_600 = (uv_loop_t *)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  puStack_600 = puVar5;
  if ((uv_loop_t *)getaddrinfo_handle == puVar6) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    puStack_608 = (uv_loop_t *)0x158eef;
    free(puVar6);
    uv_freeaddrinfo(ai);
    return;
  }
  puStack_608 = (uv_loop_t *)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  puStack_608 = puVar5;
  puVar5 = uv_default_loop();
  iVar2 = uv_getaddrinfo(puVar5,&uStack_6a8,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_6a8.addrinfo);
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req_00 = getaddrinfo_handles;
  piVar9 = callback_counts;
  lVar10 = 0;
  do {
    *piVar9 = 0;
    puVar5 = (uv_loop_t *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015906c:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159071;
    }
    *puVar8 = (int)lVar10;
    req_00->data = puVar8;
    puVar5 = uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar5,req_00,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar2 != 0) goto LAB_0015906c;
    lVar10 = lVar10 + 1;
    req_00 = req_00 + 1;
    piVar9 = piVar9 + 1;
  } while (lVar10 != 10);
  puVar5 = uv_default_loop();
  lVar10 = 0;
  uv_run(puVar5,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar10) != 1) goto LAB_00159071;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x28);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return;
  }
LAB_00159076:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar5->data;
  piVar9 = callback_counts;
  puVar6 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar10 = 0;
  do {
    puVar6 = (uv_loop_t *)((puVar6->wq_mutex).__size + 0x18);
    if (puVar6 == puVar5) goto LAB_001590b3;
    piVar9 = piVar9 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar10 = extraout_RDX_00;
LAB_001590b3:
  if (*(int *)&handle->data == (int)lVar10) {
    *piVar9 = *piVar9 + 1;
    free(handle);
    uv_freeaddrinfo(ai_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
LAB_00159071:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_00159076;
}

Assistant:

static void non_empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->result == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_closedir_cb_count;
}